

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket.c
# Opt level: O3

int ws_set_header(nni_list *l,char *n,char *v)

{
  int iVar1;
  char *s;
  void *pvVar2;
  char *pcVar3;
  int iVar4;
  
  s = nni_strdup(v);
  iVar4 = 2;
  if (s != (char *)0x0) {
    for (pvVar2 = nni_list_first(l); pvVar2 != (void *)0x0; pvVar2 = nni_list_next(l,pvVar2)) {
      iVar1 = nni_strcasecmp(*(char **)((long)pvVar2 + 0x10),n);
      if (iVar1 == 0) {
        nni_strfree(*(char **)((long)pvVar2 + 0x18));
        *(char **)((long)pvVar2 + 0x18) = s;
        goto LAB_0012f1fc;
      }
    }
    pvVar2 = nni_zalloc(0x20);
    if (pvVar2 == (void *)0x0) {
      nni_strfree(s);
    }
    else {
      pcVar3 = nni_strdup(n);
      *(char **)((long)pvVar2 + 0x10) = pcVar3;
      if (pcVar3 == (char *)0x0) {
        nni_strfree(s);
        nni_free(pvVar2,0x20);
      }
      else {
        *(char **)((long)pvVar2 + 0x18) = s;
        nni_list_append(l,pvVar2);
LAB_0012f1fc:
        iVar4 = 0;
      }
    }
  }
  return iVar4;
}

Assistant:

static int
ws_set_header(nni_list *l, const char *n, const char *v)
{
	return (ws_set_header_ext(l, n, v, true));
}